

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

Totals * __thiscall
Catch::anon_unknown_26::TestGroup::execute(Totals *__return_storage_ptr__,TestGroup *this)

{
  IEventListener *pIVar1;
  bool bVar2;
  TestCaseInfo *pTVar3;
  StringRef local_a0;
  reference local_90;
  FilterMatch *match;
  iterator __end2_1;
  iterator __begin2_1;
  Matches *__range2_1;
  reference local_30;
  TestCaseHandle **testCase;
  iterator __end2;
  iterator __begin2;
  set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
  *__range2;
  TestGroup *this_local;
  
  Totals::Totals(__return_storage_ptr__);
  __end2 = std::
           set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
           ::begin(&this->m_tests);
  testCase = (TestCaseHandle **)
             std::
             set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
             ::end(&this->m_tests);
  while (bVar2 = std::operator!=(&__end2,(_Self *)&testCase), bVar2) {
    local_30 = std::_Rb_tree_const_iterator<const_Catch::TestCaseHandle_*>::operator*(&__end2);
    bVar2 = RunContext::aborting(&this->m_context);
    if (bVar2) {
      pIVar1 = this->m_reporter;
      pTVar3 = TestCaseHandle::getTestCaseInfo(*local_30);
      (*pIVar1->_vptr_IEventListener[0x12])(pIVar1,pTVar3);
    }
    else {
      RunContext::runTest((Totals *)&__range2_1,&this->m_context,*local_30);
      Totals::operator+=(__return_storage_ptr__,(Totals *)&__range2_1);
    }
    std::_Rb_tree_const_iterator<const_Catch::TestCaseHandle_*>::operator++(&__end2);
  }
  __end2_1 = std::
             vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
             begin(&this->m_matches);
  match = (FilterMatch *)
          std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
          end(&this->m_matches);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<Catch::TestSpec::FilterMatch_*,_std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>_>
                             *)&match), bVar2) {
    local_90 = __gnu_cxx::
               __normal_iterator<Catch::TestSpec::FilterMatch_*,_std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>_>
               ::operator*(&__end2_1);
    bVar2 = std::
            vector<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>::
            empty(&local_90->tests);
    if (bVar2) {
      this->m_unmatchedTestSpecs = true;
      pIVar1 = this->m_reporter;
      StringRef::StringRef(&local_a0,&local_90->name);
      (*pIVar1->_vptr_IEventListener[2])(pIVar1,local_a0.m_start,local_a0.m_size);
    }
    __gnu_cxx::
    __normal_iterator<Catch::TestSpec::FilterMatch_*,_std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>_>
    ::operator++(&__end2_1);
  }
  return __return_storage_ptr__;
}

Assistant:

Totals execute() {
                Totals totals;
                for (auto const& testCase : m_tests) {
                    if (!m_context.aborting())
                        totals += m_context.runTest(*testCase);
                    else
                        m_reporter->skipTest(testCase->getTestCaseInfo());
                }

                for (auto const& match : m_matches) {
                    if (match.tests.empty()) {
                        m_unmatchedTestSpecs = true;
                        m_reporter->noMatchingTestCases( match.name );
                    }
                }

                return totals;
            }